

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereIsCoveringIndexWalkCallback(Walker *pWalk,Expr *pExpr)

{
  int iTab;
  CoveringIndexCheck *pCVar1;
  Index *pIVar2;
  int iVar3;
  ushort uVar4;
  ulong uVar5;
  long lVar6;
  
  pCVar1 = (pWalk->u).pCovIdxCk;
  pIVar2 = pCVar1->pIdx;
  if ((pExpr->op == 0xa9) || (pExpr->op == 0xa7)) {
    if (pExpr->iTable == pCVar1->iTabCur) {
      if ((ulong)pIVar2->nColumn != 0) {
        uVar5 = 0;
        do {
          if (pIVar2->aiColumn[uVar5] == pExpr->iColumn) {
            return 0;
          }
          uVar5 = uVar5 + 1;
        } while (pIVar2->nColumn != uVar5);
      }
      pCVar1->bUnidx = '\x01';
      return 2;
    }
  }
  else {
    if ((pIVar2->field_0x64 & 8) == 0) {
      return 0;
    }
    uVar4 = pIVar2->nColumn;
    if (uVar4 == 0) {
      return 0;
    }
    iTab = pCVar1->iTabCur;
    lVar6 = 4;
    uVar5 = 0;
    do {
      if (pIVar2->aiColumn[uVar5] == -2) {
        iVar3 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                   *(Expr **)((long)pIVar2->aColExpr->a + lVar6 * 2 + -8),iTab);
        if (iVar3 == 0) {
          pCVar1->bExpr = '\x01';
          return 1;
        }
        uVar4 = pIVar2->nColumn;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0xc;
    } while (uVar5 < uVar4);
  }
  return 0;
}

Assistant:

static int whereIsCoveringIndexWalkCallback(Walker *pWalk, Expr *pExpr){
  int i;                    /* Loop counter */
  const Index *pIdx;        /* The index of interest */
  const i16 *aiColumn;      /* Columns contained in the index */
  u16 nColumn;              /* Number of columns in the index */
  CoveringIndexCheck *pCk;  /* Info about this search */

  pCk = pWalk->u.pCovIdxCk;
  pIdx = pCk->pIdx;
  if( (pExpr->op==TK_COLUMN || pExpr->op==TK_AGG_COLUMN) ){
    /* if( pExpr->iColumn<(BMS-1) && pIdx->bHasExpr==0 ) return WRC_Continue;*/
    if( pExpr->iTable!=pCk->iTabCur ) return WRC_Continue;
    pIdx = pWalk->u.pCovIdxCk->pIdx;
    aiColumn = pIdx->aiColumn;
    nColumn = pIdx->nColumn;
    for(i=0; i<nColumn; i++){
      if( aiColumn[i]==pExpr->iColumn ) return WRC_Continue;
    }
    pCk->bUnidx = 1;
    return WRC_Abort;
  }else if( pIdx->bHasExpr
         && exprIsCoveredByIndex(pExpr, pIdx, pWalk->u.pCovIdxCk->iTabCur) ){
    pCk->bExpr = 1;
    return WRC_Prune;
  }
  return WRC_Continue;
}